

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_base.h
# Opt level: O1

void __thiscall alex::LinearModelBuilder<int>::build(LinearModelBuilder<int> *this)

{
  longdouble lVar1;
  longdouble lVar2;
  int iVar3;
  int iVar4;
  LinearModel<int> *pLVar5;
  int iVar6;
  undefined1 auVar7 [16];
  longdouble lVar8;
  longdouble lVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined8 in_XMM2_Qb;
  
  iVar3 = this->count_;
  if (iVar3 < 2) {
    pLVar5 = this->model_;
    pLVar5->a_ = 0.0;
    pLVar5->b_ = (double)this->y_sum_;
    return;
  }
  lVar8 = (longdouble)iVar3;
  lVar1 = this->x_sum_;
  lVar9 = this->xx_sum_ * lVar8 - lVar1 * lVar1;
  if ((lVar9 != (longdouble)0) || (NAN(lVar9) || NAN((longdouble)0))) {
    lVar2 = this->y_sum_;
    dVar10 = (double)((this->xy_sum_ * lVar8 + -lVar1 * lVar2) / lVar9);
    pLVar5 = this->model_;
    pLVar5->a_ = dVar10;
    pLVar5->b_ = (double)((lVar2 - lVar1 * (longdouble)dVar10) / lVar8);
    if (0.0 < dVar10) {
      return;
    }
    iVar4 = this->x_min_;
    iVar6 = this->x_max_ - iVar4;
    if (iVar6 != 0) {
      dVar10 = (this->y_max_ - this->y_min_) / (double)iVar6;
      pLVar5->a_ = dVar10;
      auVar11._0_8_ = (double)iVar4;
      auVar11._8_8_ = in_XMM2_Qb;
      auVar7._8_8_ = 0x8000000000000000;
      auVar7._0_8_ = 0x8000000000000000;
      auVar7 = vxorpd_avx512vl(auVar11,auVar7);
      dVar10 = dVar10 * auVar7._0_8_;
      goto LAB_001050dd;
    }
    pLVar5->a_ = 0.0;
  }
  else {
    pLVar5 = this->model_;
    pLVar5->a_ = 0.0;
    lVar2 = this->y_sum_;
  }
  dVar10 = (double)lVar2 / (double)iVar3;
LAB_001050dd:
  pLVar5->b_ = dVar10;
  return;
}

Assistant:

void build() {
    if (count_ <= 1) {
      model_->a_ = 0;
      model_->b_ = static_cast<double>(y_sum_);
      return;
    }

    if (static_cast<long double>(count_) * xx_sum_ - x_sum_ * x_sum_ == 0) {
      // all values in a bucket have the same key.
      model_->a_ = 0;
      model_->b_ = static_cast<double>(y_sum_) / count_;
      return;
    }

    auto slope = static_cast<double>(
        (static_cast<long double>(count_) * xy_sum_ - x_sum_ * y_sum_) /
        (static_cast<long double>(count_) * xx_sum_ - x_sum_ * x_sum_));
    auto intercept = static_cast<double>(
        (y_sum_ - static_cast<long double>(slope) * x_sum_) / count_);
    model_->a_ = slope;
    model_->b_ = intercept;

    // If floating point precision errors, fit spline
    if (model_->a_ <= 0) {
      if (x_max_ - x_min_ == 0){
        model_->a_ = 0;
        model_->b_ = static_cast<double>(y_sum_) / count_;
      }
      else{
        model_->a_ = (y_max_ - y_min_) / (x_max_ - x_min_);
        model_->b_ = -static_cast<double>(x_min_) * model_->a_;
      }
    }
  }